

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O3

MemberSyntax * __thiscall
slang::parsing::Parser::parseClockingDeclaration(Parser *this,AttrList attributes)

{
  BumpAllocator *alloc;
  SyntaxNode *pSVar1;
  Token edge;
  Token name;
  Token at;
  Token semi;
  Token defaultKeyword;
  bool bVar2;
  bool bVar3;
  int iVar4;
  ClockingDeclarationSyntax *pCVar5;
  SourceLocation SVar6;
  NameSyntax *expr;
  Diagnostic *this_00;
  undefined4 extraout_var;
  NamedBlockClauseSyntax *endBlock;
  Info *pIVar7;
  long extraout_RDX;
  byte bVar8;
  Token *this_01;
  bool bVar9;
  Token TVar10;
  string_view sVar11;
  SourceRange range;
  Token clocking;
  Token clocking_00;
  MemberSyntax *member;
  Token endClocking;
  SmallVector<slang::syntax::MemberSyntax_*,_8UL> members;
  Token local_1b8;
  Token local_1a8;
  SignalEventExpressionSyntax *local_198;
  pointer local_190;
  size_t local_188;
  undefined8 local_180;
  MemberSyntax *local_178;
  Info *local_170;
  undefined8 local_168;
  Info *local_160;
  undefined8 local_158;
  Info *local_150;
  Token *local_148;
  Token *local_140;
  Token local_138;
  SyntaxList<slang::syntax::MemberSyntax> local_128;
  undefined8 local_f0;
  Info *pIStack_e8;
  undefined8 local_e0;
  Info *pIStack_d8;
  Token local_d0;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> local_c0;
  Token local_68;
  Token local_50;
  Token local_40;
  
  local_188 = (size_t)attributes._M_extent._M_extent_value;
  local_190 = attributes._M_ptr;
  Token::Token(&local_1a8);
  bVar2 = ParserBase::peek(&this->super_ParserBase,ClockingKeyword);
  if (!bVar2) {
    local_1a8 = ParserBase::consume(&this->super_ParserBase);
  }
  TVar10 = ParserBase::expect(&this->super_ParserBase,ClockingKeyword);
  pIVar7 = TVar10.info;
  local_180 = TVar10._0_8_;
  local_1b8 = ParserBase::consumeIf(&this->super_ParserBase,Identifier);
  if (local_1a8.kind == DefaultKeyword) {
    if (local_1b8.info != (Info *)0x0) {
      bVar2 = ParserBase::peek(&this->super_ParserBase,Semicolon);
      defaultKeyword = local_1a8;
      TVar10 = local_1b8;
      if (bVar2) {
        local_c0.super_SyntaxListBase.super_SyntaxNode.kind = 1;
        local_c0.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
        local_c0.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
        local_c0.super_SyntaxListBase.childCount = local_188;
        local_c0.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr
             = local_190;
        local_c0.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.
        _M_extent._M_extent_value = local_188;
        local_c0.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_005c8770;
        local_68.kind = local_1b8.kind;
        local_68._2_1_ = local_1b8._2_1_;
        local_68.numFlags.raw = local_1b8.numFlags.raw;
        local_68.rawLen = local_1b8.rawLen;
        local_68.info = local_1b8.info;
        local_1b8 = TVar10;
        local_d0 = ParserBase::consume(&this->super_ParserBase);
        name.info = local_68.info;
        name.kind = local_68.kind;
        name._2_1_ = local_68._2_1_;
        name.numFlags.raw = local_68.numFlags.raw;
        name.rawLen = local_68.rawLen;
        clocking.info = pIVar7;
        clocking.kind = (undefined2)local_180;
        clocking._2_1_ = local_180._2_1_;
        clocking.numFlags.raw = local_180._3_1_;
        clocking.rawLen = local_180._4_4_;
        pCVar5 = (ClockingDeclarationSyntax *)
                 slang::syntax::SyntaxFactory::defaultClockingReference
                           (&this->factory,&local_c0,defaultKeyword,clocking,name,local_d0);
        return &pCVar5->super_MemberSyntax;
      }
      goto LAB_003ae7e8;
    }
  }
  else {
LAB_003ae7e8:
    if (local_1b8.info != (Info *)0x0) goto LAB_003ae826;
  }
  alloc = (this->super_ParserBase).alloc;
  local_c0.super_SyntaxListBase._0_16_ = ParserBase::peek(&this->super_ParserBase);
  SVar6 = Token::location((Token *)&local_c0);
  local_1b8 = Token::createMissing(alloc,Identifier,SVar6);
LAB_003ae826:
  if ((local_1a8.info == (Info *)0x0) && (sVar11 = Token::valueText(&local_1b8), sVar11._M_len == 0)
     ) {
    local_c0.super_SyntaxListBase._0_16_ = ParserBase::peek(&this->super_ParserBase);
    SVar6 = Token::location((Token *)&local_c0);
    ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x90005,SVar6);
  }
  TVar10 = ParserBase::expect(&this->super_ParserBase,At);
  local_160 = TVar10.info;
  local_158 = TVar10._0_8_;
  bVar2 = ParserBase::peek(&this->super_ParserBase,OpenParenthesis);
  local_150 = pIVar7;
  if (bVar2) {
    local_198 = (SignalEventExpressionSyntax *)parseEventExpression(this);
  }
  else {
    bVar2 = ParserBase::peek(&this->super_ParserBase,SystemIdentifier);
    if (bVar2) {
      this_01 = &local_40;
      Token::Token(this_01);
      expr = (NameSyntax *)
             parsePrimaryExpression(this,(bitmask<slang::parsing::detail::ExpressionOptions>)0x0);
    }
    else {
      this_01 = &local_50;
      Token::Token(this_01);
      expr = parseName(this);
    }
    edge.kind = this_01->kind;
    edge._2_1_ = this_01->field_0x2;
    edge.numFlags.raw = (this_01->numFlags).raw;
    edge.rawLen = this_01->rawLen;
    edge.info = this_01->info;
    local_198 = slang::syntax::SyntaxFactory::signalEventExpression
                          (&this->factory,edge,&expr->super_ExpressionSyntax,
                           (IffEventClauseSyntax *)0x0);
  }
  TVar10 = ParserBase::expect(&this->super_ParserBase,Semicolon);
  local_170 = TVar10.info;
  local_168 = TVar10._0_8_;
  Token::Token(&local_138);
  local_c0.super_SyntaxListBase.super_SyntaxNode._0_8_ = 0;
  local_c0.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)((long)&local_c0 + 0x18);
  local_c0.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x8;
  local_140 = &(this->super_ParserBase).lastPoppedDelims.first;
  local_148 = &(this->super_ParserBase).lastPoppedDelims.second;
  bVar2 = false;
  while( true ) {
    TVar10 = ParserBase::peek(&this->super_ParserBase);
    if ((TVar10.kind == EndOfFile) || ((TVar10._0_4_ & 0xffff) == 0x92)) break;
    local_178 = parseClockingItem(this);
    bVar9 = local_178 == (MemberSyntax *)0x0;
    if (bVar9) {
      bVar3 = slang::syntax::SyntaxFacts::isCloseDelimOrKeyword(TVar10.kind);
      if (bVar3) {
        local_128.super_SyntaxListBase._0_16_ = ParserBase::peek(&this->super_ParserBase);
        range = Token::range((Token *)&local_128);
        this_00 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0xb80005,range);
        local_128.super_SyntaxListBase._0_16_ = ParserBase::peek(&this->super_ParserBase);
        sVar11 = Token::valueText((Token *)&local_128);
        Diagnostic::operator<<(this_00,sVar11);
        bVar8 = 0;
        if (((this->super_ParserBase).lastPoppedDelims.first.info != (Info *)0x0) &&
           ((this->super_ParserBase).lastPoppedDelims.second.info != (Info *)0x0)) {
          SVar6 = Token::location(local_140);
          Diagnostic::addNote(this_00,(DiagCode)0xc10005,SVar6);
          SVar6 = Token::location(local_148);
          Diagnostic::addNote(this_00,(DiagCode)0xc00005,SVar6);
          bVar8 = 0;
        }
      }
      else {
        bVar8 = ~bVar2 & 1;
      }
      ParserBase::skipToken
                (&this->super_ParserBase,
                 (optional<slang::DiagCode>)((uint6)bVar8 << 0x20 | 0x450005));
      bVar2 = bVar9;
    }
    else {
      checkMemberAllowed(this,&local_178->super_SyntaxNode,ClockingDeclaration);
      SmallVectorBase<slang::syntax::MemberSyntax*>::
      emplace_back<slang::syntax::MemberSyntax*const&>
                ((SmallVectorBase<slang::syntax::MemberSyntax*> *)&local_c0,&local_178);
      pSVar1 = this->previewNode;
      this->previewNode = (SyntaxNode *)0x0;
      (local_178->super_SyntaxNode).previewNode = pSVar1;
      bVar2 = bVar9;
    }
  }
  local_138 = ParserBase::expect(&this->super_ParserBase,EndClockingKeyword);
  iVar4 = SmallVectorBase<slang::syntax::MemberSyntax_*>::copy
                    ((SmallVectorBase<slang::syntax::MemberSyntax_*> *)&local_c0,
                     (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,(EVP_PKEY_CTX *)local_138.info);
  if ((pointer)local_c0.super_SyntaxListBase._vptr_SyntaxListBase !=
      (pointer)((long)&local_c0 + 0x18U)) {
    operator_delete(local_c0.super_SyntaxListBase._vptr_SyntaxListBase);
  }
  if (extraout_RDX != 0 && local_1a8.kind == GlobalKeyword) {
    local_c0.super_SyntaxListBase._0_16_ =
         slang::syntax::SyntaxNode::getFirstToken
                   (&(*(pointer)CONCAT44(extraout_var,iVar4))->super_SyntaxNode);
    SVar6 = Token::location((Token *)&local_c0);
    ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x5d0005,SVar6);
  }
  endBlock = parseNamedBlockClause(this);
  checkBlockNames(this,local_1b8,endBlock);
  local_c0.super_SyntaxListBase.super_SyntaxNode.kind = 1;
  local_c0.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
  local_c0.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  local_c0.super_SyntaxListBase.childCount = local_188;
  local_c0.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       local_190;
  local_c0.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = local_188;
  local_c0.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_005c8770;
  local_e0 = local_158;
  pIStack_d8 = local_160;
  local_f0 = local_168;
  pIStack_e8 = local_170;
  local_128.super_SyntaxListBase.super_SyntaxNode.kind = 1;
  local_128.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
  local_128.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  local_128.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_005cb390;
  at.info = local_160;
  at.kind = (undefined2)local_158;
  at._2_1_ = local_158._2_1_;
  at.numFlags.raw = local_158._3_1_;
  at.rawLen = local_158._4_4_;
  semi.info = local_170;
  semi.kind = (undefined2)local_168;
  semi._2_1_ = local_168._2_1_;
  semi.numFlags.raw = local_168._3_1_;
  semi.rawLen = local_168._4_4_;
  clocking_00.info = local_150;
  clocking_00.kind = (undefined2)local_180;
  clocking_00._2_1_ = local_180._2_1_;
  clocking_00.numFlags.raw = local_180._3_1_;
  clocking_00.rawLen = local_180._4_4_;
  local_128.super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>._M_ptr =
       (pointer)CONCAT44(extraout_var,iVar4);
  pCVar5 = slang::syntax::SyntaxFactory::clockingDeclaration
                     (&this->factory,&local_c0,local_1a8,clocking_00,local_1b8,at,
                      &local_198->super_EventExpressionSyntax,semi,&local_128,local_138,endBlock);
  return &pCVar5->super_MemberSyntax;
}

Assistant:

MemberSyntax& Parser::parseClockingDeclaration(AttrList attributes) {
    Token globalOrDefault;
    if (!peek(TokenKind::ClockingKeyword))
        globalOrDefault = consume();

    Token clocking = expect(TokenKind::ClockingKeyword);
    Token blockName = consumeIf(TokenKind::Identifier);

    // If this is a default reference there is no body to parse.
    if (globalOrDefault.kind == TokenKind::DefaultKeyword && blockName &&
        peek(TokenKind::Semicolon)) {
        return factory.defaultClockingReference(attributes, globalOrDefault, clocking, blockName,
                                                consume());
    }

    if (!blockName)
        blockName = Token::createMissing(alloc, TokenKind::Identifier, peek().location());

    if (!globalOrDefault && blockName.valueText().empty())
        addDiag(diag::ClockingNameEmpty, peek().location());

    Token at = expect(TokenKind::At);

    EventExpressionSyntax* event;
    if (peek(TokenKind::OpenParenthesis)) {
        event = &parseEventExpression();
    }
    else if (peek(TokenKind::SystemIdentifier)) {
        event = &factory.signalEventExpression({}, parsePrimaryExpression(ExpressionOptions::None),
                                               nullptr);
    }
    else {
        event = &factory.signalEventExpression({}, parseName(), nullptr);
    }

    Token semi = expect(TokenKind::Semicolon);
    Token endClocking;
    auto members = parseMemberList<MemberSyntax>(
        TokenKind::EndClockingKeyword, endClocking, SyntaxKind::ClockingDeclaration,
        [this](SyntaxKind, bool&) { return parseClockingItem(); });

    if (globalOrDefault.kind == TokenKind::GlobalKeyword && !members.empty())
        addDiag(diag::GlobalClockingEmpty, members[0]->getFirstToken().location());

    NamedBlockClauseSyntax* endBlockName = parseNamedBlockClause();
    checkBlockNames(blockName, endBlockName);

    return factory.clockingDeclaration(attributes, globalOrDefault, clocking, blockName, at, *event,
                                       semi, members, endClocking, endBlockName);
}